

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  string *psVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  WeightParamType WVar9;
  WeightParams *pWVar10;
  long *plVar11;
  BatchnormLayerParams *pBVar12;
  LayerUnion LVar13;
  uint32 uVar14;
  size_type *psVar15;
  uint uVar16;
  Result *_result;
  bool bVar17;
  string err;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Rep *local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Batchnorm","");
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Batchnorm","");
    validateRankCount(__return_storage_ptr__,layer,&local_98,3,-1,&this->blobNameToRank);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    LVar13 = layer->layer_;
    uVar14 = 0xa0;
  }
  else {
    LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    uVar14 = layer->_oneof_case_[0];
  }
  pWVar10 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar2 = (pWVar10->floatvalue_).current_size_;
  uVar16 = (0 < iVar2) + 1;
  if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
    uVar16 = (uint)(0 < iVar2);
  }
  if ((iVar2 < 1) ||
     (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
      (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) != 1)) {
    if (uVar14 == 0xa0) {
      LVar13 = layer->layer_;
      uVar14 = 0xa0;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      uVar14 = layer->_oneof_case_[0];
    }
    pWVar10 = (LVar13.innerproduct_)->bias_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar10->floatvalue_).current_size_;
    uVar16 = (0 < iVar2) + 1;
    if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
      uVar16 = (uint)(0 < iVar2);
    }
    if ((0 < iVar2) &&
       (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_002f5165;
    if (uVar14 == 0xa0) {
      LVar13 = layer->layer_;
      uVar14 = 0xa0;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      uVar14 = layer->_oneof_case_[0];
    }
    pWVar10 = (LVar13.batchnorm_)->mean_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar10->floatvalue_).current_size_;
    uVar16 = (0 < iVar2) + 1;
    if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
      uVar16 = (uint)(0 < iVar2);
    }
    if ((0 < iVar2) &&
       (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) == 1)) goto LAB_002f5165;
    if (uVar14 == 0xa0) {
      LVar13 = layer->layer_;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar10 = (LVar13.batchnorm_)->variance_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar10->floatvalue_).current_size_;
    uVar16 = (0 < iVar2) + 1;
    if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
      uVar16 = (uint)(0 < iVar2);
    }
    uVar7 = (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0);
    uVar16 = (uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
    bVar8 = 1 < uVar16 - uVar7 || (uVar16 == uVar7 || iVar2 < 1);
    uVar14 = layer->_oneof_case_[0];
  }
  else {
LAB_002f5165:
    bVar8 = false;
  }
  if (uVar14 == 0xa0) {
    LVar13 = layer->layer_;
  }
  else {
    LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
  }
  pWVar10 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar2 = (pWVar10->floatvalue_).current_size_;
  sVar4 = ((pWVar10->float16value_).ptr_)->_M_string_length;
  uVar16 = (0 < iVar2) + 1;
  if (sVar4 == 0) {
    uVar16 = (uint)(0 < iVar2);
  }
  uVar7 = (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0);
  uVar16 = (uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
  if ((((uVar16 - uVar7 < 2) && (sVar4 != 0)) && (iVar2 < 1)) && (uVar16 != uVar7)) {
LAB_002f52d3:
    bVar17 = false;
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar13 = layer->layer_;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar10 = (LVar13.innerproduct_)->bias_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar10->floatvalue_).current_size_;
    sVar4 = ((pWVar10->float16value_).ptr_)->_M_string_length;
    uVar16 = (0 < iVar2) + 1;
    if (sVar4 == 0) {
      uVar16 = (uint)(0 < iVar2);
    }
    uVar7 = (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0);
    uVar16 = (uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
    if (((uVar16 - uVar7 < 2) && (sVar4 != 0)) && ((iVar2 < 1 && (uVar16 != uVar7))))
    goto LAB_002f52d3;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar13 = layer->layer_;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar10 = (LVar13.batchnorm_)->mean_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar2 = (pWVar10->floatvalue_).current_size_;
    sVar4 = ((pWVar10->float16value_).ptr_)->_M_string_length;
    uVar16 = (0 < iVar2) + 1;
    if (sVar4 == 0) {
      uVar16 = (uint)(0 < iVar2);
    }
    uVar7 = (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0);
    uVar16 = (uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2;
    if (((uVar16 - uVar7 < 2) && (sVar4 != 0)) && ((iVar2 < 1 && (uVar16 != uVar7))))
    goto LAB_002f52d3;
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar13 = layer->layer_;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar10 = (LVar13.batchnorm_)->variance_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar9 = valueType(pWVar10);
    bVar17 = WVar9 != FLOAT16;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    LVar13 = layer->layer_;
  }
  else {
    LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
  }
  pWVar10 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).relu_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  bVar6 = 0 < (pWVar10->floatvalue_).current_size_;
  uVar16 = bVar6 + 1;
  if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
    uVar16 = (uint)bVar6;
  }
  if (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
      (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
    if (layer->_oneof_case_[0] == 0xa0) {
      LVar13 = layer->layer_;
    }
    else {
      LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
    }
    pWVar10 = (LVar13.innerproduct_)->bias_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    bVar6 = 0 < (pWVar10->floatvalue_).current_size_;
    uVar16 = bVar6 + 1;
    if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
      uVar16 = (uint)bVar6;
    }
    if (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
        (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
      if (layer->_oneof_case_[0] == 0xa0) {
        LVar13 = layer->layer_;
      }
      else {
        LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
      }
      pWVar10 = (LVar13.batchnorm_)->mean_;
      if (pWVar10 == (WeightParams *)0x0) {
        pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bVar6 = 0 < (pWVar10->floatvalue_).current_size_;
      uVar16 = bVar6 + 1;
      if (((pWVar10->float16value_).ptr_)->_M_string_length == 0) {
        uVar16 = (uint)bVar6;
      }
      if (((uVar16 - (((pWVar10->rawvalue_).ptr_)->_M_string_length == 0)) + 2) -
          (uint)(((pWVar10->int8rawvalue_).ptr_)->_M_string_length == 0) < 2) {
        if (layer->_oneof_case_[0] == 0xa0) {
          LVar13 = layer->layer_;
        }
        else {
          LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
        }
        pWVar10 = (LVar13.batchnorm_)->variance_;
        if (pWVar10 == (WeightParams *)0x0) {
          pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        WVar9 = valueType(pWVar10);
        if (((bool)(bVar8 | bVar17)) && (WVar9 != UNSPECIFIED)) {
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = (LayerUnion)(layer->layer_).convolution_;
            local_58 = (Rep *)(LVar13.batchnorm_)->channels_;
          }
          else {
            pBVar12 = Specification::BatchnormLayerParams::default_instance();
            local_58 = (Rep *)pBVar12->channels_;
            if (layer->_oneof_case_[0] == 0xa0) {
              LVar13 = layer->layer_;
            }
            else {
              LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
            }
          }
          pWVar10 = (WeightParams *)((LVar13.activation_)->NonlinearityType_).linear_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
          psVar5 = (layer->name_).ptr_;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"gamma","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar10,(uint64_t)local_58,1,&local_98,psVar5,&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar8 = Result::good(__return_storage_ptr__);
          if (!bVar8) {
            return __return_storage_ptr__;
          }
          pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = layer->layer_;
          }
          else {
            LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          pWVar10 = (LVar13.innerproduct_)->bias_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
          psVar5 = (layer->name_).ptr_;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"beta","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,pWVar10,(uint64_t)local_58,1,&local_98,psVar5,&local_78)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          bVar8 = Result::good(__return_storage_ptr__);
          if (!bVar8) {
            return __return_storage_ptr__;
          }
          pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = layer->layer_;
          }
          else {
            LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          if ((LVar13.batchnorm_)->computemeanvar_ != false) {
LAB_002f57dc:
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          if (layer->_oneof_case_[0] == 0xa0) {
            LVar13 = layer->layer_;
          }
          else {
            LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
          }
          pWVar10 = (LVar13.batchnorm_)->mean_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar9 = valueType(pWVar10);
          if (WVar9 != EMPTY) {
            if (layer->_oneof_case_[0] == 0xa0) {
              LVar13 = layer->layer_;
            }
            else {
              LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
            }
            pWVar10 = (LVar13.batchnorm_)->mean_;
            if (pWVar10 == (WeightParams *)0x0) {
              pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            WVar9 = valueType(pWVar10);
            if (WVar9 != EMPTY) {
              if (layer->_oneof_case_[0] == 0xa0) {
                LVar13 = layer->layer_;
              }
              else {
                LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
              }
              pWVar10 = (LVar13.batchnorm_)->mean_;
              if (pWVar10 == (WeightParams *)0x0) {
                pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
              psVar5 = (layer->name_).ptr_;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"mean","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar10,(uint64_t)local_58,1,&local_98,psVar5,
                         &local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar8 = Result::good(__return_storage_ptr__);
              if (!bVar8) {
                return __return_storage_ptr__;
              }
              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              if (layer->_oneof_case_[0] == 0xa0) {
                LVar13 = layer->layer_;
              }
              else {
                LVar13.batchnorm_ = Specification::BatchnormLayerParams::default_instance();
              }
              pWVar10 = (LVar13.batchnorm_)->variance_;
              if (pWVar10 == (WeightParams *)0x0) {
                pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"BatchNorm","");
              psVar5 = (layer->name_).ptr_;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"variance","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,pWVar10,(uint64_t)local_58,1,&local_98,psVar5,
                         &local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              bVar8 = Result::good(__return_storage_ptr__);
              if (!bVar8) {
                return __return_storage_ptr__;
              }
              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              goto LAB_002f57dc;
            }
          }
          std::operator+(&local_78,"Batchnorm layer \'",(layer->name_).ptr_);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_78);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_98.field_2._M_allocated_capacity = *psVar15;
            local_98.field_2._8_8_ = plVar11[3];
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar15;
            local_98._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_98._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_98.field_2) {
            return __return_storage_ptr__;
          }
          goto LAB_002f54dd;
        }
      }
    }
  }
  std::operator+(&local_78,"Batchnorm layer \'",(layer->name_).ptr_);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_78);
  psVar15 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_98.field_2._M_allocated_capacity = *psVar15;
    local_98.field_2._8_8_ = plVar11[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar15;
    local_98._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_98._M_string_length = plVar11[1];
  *plVar11 = (long)psVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return __return_storage_ptr__;
  }
LAB_002f54dd:
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}